

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O2

Status __thiscall leveldb::DBImpl::Get(DBImpl *this,ReadOptions *options,Slice *key,string *value)

{
  Version *this_00;
  SequenceNumber s;
  MemTable *this_01;
  MemTable *this_02;
  Version *this_03;
  bool bVar1;
  SequenceNumber *pSVar2;
  string *in_R8;
  MutexLock l;
  GetStats stats;
  LookupKey lkey;
  undefined1 local_138 [40];
  LookupKey local_110;
  
  (this->super_DB)._vptr_DB = (_func_int **)0x0;
  this_00 = (Version *)(options + 0xc);
  local_138._8_8_ = this_00;
  port::Mutex::Lock((Mutex *)this_00);
  pSVar2 = (SequenceNumber *)(key->size_ + 8);
  if (key->size_ == 0) {
    pSVar2 = (SequenceNumber *)(*(long *)(options + 0x22) + 0x58);
  }
  s = *pSVar2;
  this_01 = (MemTable *)options[0x12].snapshot;
  this_02 = *(MemTable **)(options + 0x13);
  this_03 = *(Version **)(*(long *)(options + 0x22) + 0x168);
  this_01->refs_ = this_01->refs_ + 1;
  if (this_02 != (MemTable *)0x0) {
    this_02->refs_ = this_02->refs_ + 1;
  }
  local_138._16_8_ = key;
  Version::Ref(this_03);
  port::Mutex::Unlock((Mutex *)this_00);
  LookupKey::LookupKey(&local_110,(Slice *)value,s);
  bVar1 = MemTable::Get(this_01,&local_110,in_R8,(Status *)this);
  if (bVar1) {
LAB_00109340:
    bVar1 = false;
  }
  else {
    if (this_02 != (MemTable *)0x0) {
      bVar1 = MemTable::Get(this_02,&local_110,in_R8,(Status *)this);
      if (bVar1) goto LAB_00109340;
    }
    Version::Get((Version *)local_138,(ReadOptions *)this_03,(LookupKey *)local_138._16_8_,
                 (string *)&local_110,(GetStats *)in_R8);
    Status::operator=((Status *)this,(Status *)local_138);
    Status::~Status((Status *)local_138);
    bVar1 = true;
  }
  port::Mutex::Lock((Mutex *)this_00);
  LookupKey::~LookupKey(&local_110);
  if (bVar1) {
    bVar1 = Version::UpdateStats(this_03,(GetStats *)(local_138 + 0x18));
    if (bVar1) {
      MaybeScheduleCompaction((DBImpl *)options);
    }
  }
  MemTable::Unref(this_01);
  if (this_02 != (MemTable *)0x0) {
    MemTable::Unref(this_02);
  }
  Version::Unref(this_03);
  MutexLock::~MutexLock((MutexLock *)(local_138 + 8));
  return (Status)(char *)this;
}

Assistant:

Status DBImpl::Get(const ReadOptions &options,
                   const Slice &key,
                   std::string *value) {
  Status s;
  MutexLock l(&mutex_);
  SequenceNumber snapshot;
  if (options.snapshot!=NULL) {
    snapshot = reinterpret_cast<const SnapshotImpl *>(options.snapshot)->number_;
  } else {
    snapshot = versions_->LastSequence();
  }

  MemTable *mem = mem_;
  MemTable *imm = imm_;
  Version *current = versions_->current();
  mem->Ref();
  if (imm!=NULL) imm->Ref();
  current->Ref();

  bool have_stat_update = false;
  Version::GetStats stats;

  // Unlock while reading from files and memtables
  {
    mutex_.Unlock();
    // First look in the memtable, then in the immutable memtable (if any).
    LookupKey lkey(key, snapshot);
    if (mem->Get(lkey, value, &s)) {
      // Done
    } else if (imm!=NULL && imm->Get(lkey, value, &s)) {
      // Done
    } else {
      s = current->Get(options, lkey, value, &stats);
      have_stat_update = true;
    }
    mutex_.Lock();
  }

  if (have_stat_update && current->UpdateStats(stats)) {
    MaybeScheduleCompaction();
  }
  mem->Unref();
  if (imm!=NULL) imm->Unref();
  current->Unref();
  return s;
}